

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint __args;
  Index __args_1;
  bool bVar1;
  Column *pCVar2;
  Column *pCVar3;
  
  pCVar2 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
           ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
                         *)this,columnIndex1);
  pCVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
           ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
                         *)this,columnIndex2);
  __args = (pCVar2->super_Chain_column_option).pairedColumn_;
  __args_1 = (pCVar3->super_Chain_column_option).pairedColumn_;
  bVar1 = std::function<bool_(unsigned_int,_unsigned_int)>::operator()
                    (&this->birthComp_,__args,__args_1);
  if (bVar1) {
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
    ::add_to((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
              *)this,__args,__args_1);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
    ::add_to((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
              *)this,columnIndex1,columnIndex2);
  }
  else {
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
    ::add_to((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
              *)this,__args_1,__args);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
    ::add_to((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false>_>_>
              *)this,columnIndex2,columnIndex1);
    columnIndex1 = columnIndex2;
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}